

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadMaterialLibrary(ColladaParser *this)

{
  MaterialLibrary *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type_conflict *pmVar6;
  undefined4 extraout_var_00;
  _Rb_tree_color _Var7;
  string name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  names;
  string id;
  ostringstream strStream;
  key_type local_258;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  key_type local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Material local_1a8 [5];
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    local_238._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_238._M_impl.super__Rb_tree_header._M_header;
    local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->mMaterialLibrary;
    local_238._M_impl.super__Rb_tree_header._M_header._M_right =
         local_238._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') goto LAB_003ebc40;
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"material");
        if (bVar1) {
          uVar3 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8,(char *)CONCAT44(extraout_var,iVar2),
                     (allocator<char> *)local_1a8);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          local_258._M_string_length = 0;
          local_258.field_2._M_local_buf[0] = '\0';
          uVar3 = TestAttribute(this,"name");
          if (-1 < (int)uVar3) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)&local_258);
          }
          local_1a8[0].mName._M_dataplus._M_p = (pointer)&local_1a8[0].mName.field_2;
          local_1a8[0].mEffect.field_2._8_8_ = 0;
          local_1a8[0].mEffect._M_string_length = 0;
          local_1a8[0].mName.field_2._M_allocated_capacity = 0;
          local_1a8[0].mName.field_2._8_8_ = 0;
          local_1a8[0].mName._M_string_length = 0;
          local_1a8[0].mEffect._M_dataplus._M_p = (pointer)&local_1a8[0].mEffect.field_2;
          local_1a8[0].mEffect.field_2._M_allocated_capacity = 0;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](this_00,&local_1e8);
          Collada::Material::operator=(pmVar4,local_1a8);
          Collada::Material::~Material(local_1a8);
          if (local_258._M_string_length != 0) {
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&local_238,&local_258);
            if ((_Rb_tree_header *)iVar5._M_node == &local_238._M_impl.super__Rb_tree_header) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)&local_238,&local_258);
              *pmVar6 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              _Var7 = iVar5._M_node[2]._M_color + _S_black;
              iVar5._M_node[2]._M_color = _Var7;
              std::ostream::operator<<(local_1a8,_Var7);
              std::__cxx11::stringbuf::str();
              std::operator+(&local_1c8," ",&local_208);
              std::__cxx11::string::append((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            }
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                     ::operator[](this_00,&local_1e8);
            std::__cxx11::string::_M_assign((string *)pmVar4);
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](this_00,&local_1e8);
          ReadMaterial(this,pmVar4);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_materials");
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"Expected end of <library_materials> element.",
                 (allocator<char> *)&local_1e8);
      ThrowException(this,&local_1a8[0].mName);
    }
LAB_003ebc40:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_238);
  }
  return;
}

Assistant:

void ColladaParser::ReadMaterialLibrary()
{
    if (mReader->isEmptyElement())
        return;

    std::map<std::string, int> names;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("material"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                std::string name;
                int attrName = TestAttribute("name");
                if (attrName >= 0)
                    name = mReader->getAttributeValue(attrName);

                // create an entry and store it in the library under its ID
                mMaterialLibrary[id] = Material();

                if (!name.empty())
                {
                    std::map<std::string, int>::iterator it = names.find(name);
                    if (it != names.end())
                    {
                        std::ostringstream strStream;
                        strStream << ++it->second;
                        name.append(" " + strStream.str());
                    }
                    else
                    {
                        names[name] = 0;
                    }

                    mMaterialLibrary[id].mName = name;
                }

                ReadMaterial(mMaterialLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_materials") != 0)
                ThrowException("Expected end of <library_materials> element.");

            break;
        }
    }
}